

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClass.c
# Opt level: O2

Aig_Man_t * Fra_ClassesDeriveAig(Fra_Cla_t *p,int nFramesK)

{
  Aig_Man_t *pManFraig;
  char *pcVar1;
  Aig_Obj_t **ppEquivs;
  void *pvVar2;
  Aig_Obj_t *pAVar3;
  ulong *__ptr;
  Aig_Obj_t *pAVar4;
  int iVar5;
  int iVar6;
  int i;
  Aig_Man_t *pAVar7;
  int iVar8;
  ulong *puVar9;
  
  pAVar7 = p->pAig;
  if (pAVar7->nRegs < 1) {
    __assert_fail("Aig_ManRegNum(p->pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClass.c"
                  ,0x322,"Aig_Man_t *Fra_ClassesDeriveAig(Fra_Cla_t *, int)");
  }
  if (pAVar7->nObjs[2] <= pAVar7->nRegs) {
    __assert_fail("Aig_ManRegNum(p->pAig) < Aig_ManCiNum(p->pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClass.c"
                  ,0x323,"Aig_Man_t *Fra_ClassesDeriveAig(Fra_Cla_t *, int)");
  }
  if (nFramesK < 1) {
    __assert_fail("nFramesK > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClass.c"
                  ,0x324,"Aig_Man_t *Fra_ClassesDeriveAig(Fra_Cla_t *, int)");
  }
  iVar5 = nFramesK + 1;
  pManFraig = Aig_ManStart(pAVar7->vObjs->nSize * iVar5);
  pcVar1 = Abc_UtilStrsav(p->pAig->pName);
  pManFraig->pName = pcVar1;
  pcVar1 = Abc_UtilStrsav(p->pAig->pSpec);
  pManFraig->pSpec = pcVar1;
  pAVar7 = p->pAig;
  ppEquivs = (Aig_Obj_t **)malloc((long)pAVar7->vObjs->nSize << 3);
  ppEquivs[pAVar7->pConst1->Id] = pManFraig->pConst1;
  for (iVar6 = pAVar7->nObjs[2] - pAVar7->nRegs; iVar6 < pAVar7->vCis->nSize; iVar6 = iVar6 + 1) {
    pvVar2 = Vec_PtrEntry(pAVar7->vCis,iVar6);
    pAVar3 = Aig_ObjCreateCi(pManFraig);
    ppEquivs[*(int *)((long)pvVar2 + 0x24)] = pAVar3;
    pAVar7 = p->pAig;
  }
  __ptr = (ulong *)malloc((long)pAVar7->nRegs << 3);
  for (iVar6 = 0; iVar6 != iVar5; iVar6 = iVar6 + 1) {
    for (iVar8 = 0; i = pAVar7->nObjs[2] - pAVar7->nRegs, iVar8 < i; iVar8 = iVar8 + 1) {
      pvVar2 = Vec_PtrEntry(pAVar7->vCis,iVar8);
      pAVar3 = Aig_ObjCreateCi(pManFraig);
      ppEquivs[*(int *)((long)pvVar2 + 0x24)] = pAVar3;
      pAVar7 = p->pAig;
    }
    for (; i < pAVar7->vCis->nSize; i = i + 1) {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pAVar7->vCis,i);
      Fra_ClassesDeriveNode(pManFraig,pAVar3,ppEquivs);
      pAVar7 = p->pAig;
    }
    for (iVar8 = 0; iVar8 < pAVar7->vObjs->nSize; iVar8 = iVar8 + 1) {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pAVar7->vObjs,iVar8);
      if ((pAVar3 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar3->field_0x18 & 7) - 7)) {
        pAVar4 = Aig_And(pManFraig,
                         (Aig_Obj_t *)
                         ((ulong)((uint)pAVar3->pFanin0 & 1) ^
                         (ulong)ppEquivs[*(int *)(((ulong)pAVar3->pFanin0 & 0xfffffffffffffffe) +
                                                 0x24)]),
                         (Aig_Obj_t *)
                         ((ulong)((uint)pAVar3->pFanin1 & 1) ^
                         (ulong)ppEquivs[*(int *)(((ulong)pAVar3->pFanin1 & 0xfffffffffffffffe) +
                                                 0x24)]));
        ppEquivs[pAVar3->Id] = pAVar4;
        Fra_ClassesDeriveNode(pManFraig,pAVar3,ppEquivs);
      }
      pAVar7 = p->pAig;
    }
    if (iVar6 == nFramesK) break;
    if (iVar6 == nFramesK + -1) {
      pManFraig->nAsserts = pManFraig->nObjs[3];
    }
    puVar9 = __ptr;
    for (iVar8 = pAVar7->nObjs[3] - pAVar7->nRegs; iVar8 < pAVar7->vCos->nSize; iVar8 = iVar8 + 1) {
      pvVar2 = Vec_PtrEntry(pAVar7->vCos,iVar8);
      *puVar9 = (ulong)((uint)*(ulong *)((long)pvVar2 + 8) & 1) ^
                (ulong)ppEquivs[*(int *)((*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe) + 0x24)
                               ];
      pAVar7 = p->pAig;
      puVar9 = puVar9 + 1;
    }
    puVar9 = __ptr;
    for (iVar8 = pAVar7->nObjs[2] - pAVar7->nRegs; iVar8 < pAVar7->vCis->nSize; iVar8 = iVar8 + 1) {
      pvVar2 = Vec_PtrEntry(pAVar7->vCis,iVar8);
      ppEquivs[*(int *)((long)pvVar2 + 0x24)] = (Aig_Obj_t *)*puVar9;
      pAVar7 = p->pAig;
      puVar9 = puVar9 + 1;
    }
  }
  free(__ptr);
  free(ppEquivs);
  if (pManFraig->nObjs[3] % iVar5 == 0) {
    printf("Assert miters = %6d. Output miters = %6d.\n",(ulong)(uint)pManFraig->nAsserts,
           (ulong)(uint)(pManFraig->nObjs[3] - pManFraig->nAsserts));
    Aig_ManCleanup(pManFraig);
    return pManFraig;
  }
  __assert_fail("Aig_ManCoNum(pManFraig) % nFramesAll == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClass.c"
                ,0x350,"Aig_Man_t *Fra_ClassesDeriveAig(Fra_Cla_t *, int)");
}

Assistant:

Aig_Man_t * Fra_ClassesDeriveAig( Fra_Cla_t * p, int nFramesK )
{
    Aig_Man_t * pManFraig;
    Aig_Obj_t * pObj, * pObjNew;
    Aig_Obj_t ** pLatches, ** ppEquivs;
    int i, k, f, nFramesAll = nFramesK + 1;
    assert( Aig_ManRegNum(p->pAig) > 0 );
    assert( Aig_ManRegNum(p->pAig) < Aig_ManCiNum(p->pAig) );
    assert( nFramesK > 0 );
    // start the fraig package
    pManFraig = Aig_ManStart( Aig_ManObjNumMax(p->pAig) * nFramesAll );
    pManFraig->pName = Abc_UtilStrsav( p->pAig->pName );
    pManFraig->pSpec = Abc_UtilStrsav( p->pAig->pSpec );
    // allocate place for the node mapping
    ppEquivs = ABC_ALLOC( Aig_Obj_t *, Aig_ManObjNumMax(p->pAig) );
    Fra_ObjSetEqu( ppEquivs, Aig_ManConst1(p->pAig), Aig_ManConst1(pManFraig) );
    // create latches for the first frame
    Aig_ManForEachLoSeq( p->pAig, pObj, i )
        Fra_ObjSetEqu( ppEquivs, pObj, Aig_ObjCreateCi(pManFraig) );
    // add timeframes
    pLatches = ABC_ALLOC( Aig_Obj_t *, Aig_ManRegNum(p->pAig) );
    for ( f = 0; f < nFramesAll; f++ )
    {
        // create PIs for this frame
        Aig_ManForEachPiSeq( p->pAig, pObj, i )
            Fra_ObjSetEqu( ppEquivs, pObj, Aig_ObjCreateCi(pManFraig) );
        // set the constraints on the latch outputs
        Aig_ManForEachLoSeq( p->pAig, pObj, i )
            Fra_ClassesDeriveNode( pManFraig, pObj, ppEquivs );
        // add internal nodes of this frame
        Aig_ManForEachNode( p->pAig, pObj, i )
        {
            pObjNew = Aig_And( pManFraig, Fra_ObjChild0Equ(ppEquivs, pObj), Fra_ObjChild1Equ(ppEquivs, pObj) );
            Fra_ObjSetEqu( ppEquivs, pObj, pObjNew );
            Fra_ClassesDeriveNode( pManFraig, pObj, ppEquivs );
        }
        if ( f == nFramesAll - 1 )
            break;
        if ( f == nFramesAll - 2 )
            pManFraig->nAsserts = Aig_ManCoNum(pManFraig);
        // save the latch input values
        k = 0;
        Aig_ManForEachLiSeq( p->pAig, pObj, i )
            pLatches[k++] = Fra_ObjChild0Equ( ppEquivs, pObj );
        // insert them to the latch output values
        k = 0;
        Aig_ManForEachLoSeq( p->pAig, pObj, i )
            Fra_ObjSetEqu( ppEquivs, pObj, pLatches[k++] );
    }
    ABC_FREE( pLatches );
    ABC_FREE( ppEquivs );
    // mark the asserts
    assert( Aig_ManCoNum(pManFraig) % nFramesAll == 0 );
printf( "Assert miters = %6d. Output miters = %6d.\n", 
       pManFraig->nAsserts, Aig_ManCoNum(pManFraig) - pManFraig->nAsserts );
    // remove dangling nodes
    Aig_ManCleanup( pManFraig );
    return pManFraig;
}